

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v6::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  locale_ref loc;
  string_view message_00;
  bool bVar1;
  int iVar2;
  back_insert_iterator<fmt::v6::internal::buffer<char>_> out_00;
  void *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  writer w;
  int result;
  char *system_message;
  memory_buffer buf;
  allocator<char> *in_stack_fffffffffffffd08;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 uVar3;
  allocator<char> *buffer;
  undefined8 in_stack_fffffffffffffd30;
  int local_2b8;
  void *local_2b0;
  int local_2a8;
  void *local_2a0;
  locale_ref local_280;
  int in_stack_fffffffffffffd8c;
  iterator in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd98 [12];
  allocator<char> local_239;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_238;
  undefined4 local_1c;
  undefined8 local_10;
  void *pvStack_8;
  
  buffer = &local_239;
  local_1c = in_ESI;
  local_10 = in_RDX;
  pvStack_8 = in_RCX;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::allocator<char>::~allocator(&local_239);
  internal::buffer<char>::resize
            ((buffer<char> *)in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
  do {
    out_00.container =
         (buffer<char> *)internal::buffer<char>::operator[]((buffer<char> *)&local_238,0);
    uVar3 = local_1c;
    internal::buffer<char>::size((buffer<char> *)&local_238);
    iVar2 = internal::safe_strerror
                      ((int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(char **)buffer,
                       (size_t)out_00.container);
    if (iVar2 == 0) {
      buffer_range<char>::buffer_range
                ((buffer_range<char> *)out_00.container,
                 (buffer<char> *)CONCAT44(uVar3,in_stack_fffffffffffffd18));
      internal::locale_ref::locale_ref(&local_280);
      loc.locale_._4_4_ = uVar3;
      loc.locale_._0_4_ = in_stack_fffffffffffffd18;
      internal::basic_writer<fmt::v6::buffer_range<char>_>::basic_writer
                ((basic_writer<fmt::v6::buffer_range<char>_> *)in_stack_fffffffffffffd10,
                 (buffer_range<char>)out_00.container,loc);
      internal::basic_writer<fmt::v6::buffer_range<char>_>::write
                ((basic_writer<fmt::v6::buffer_range<char>_> *)&stack0xfffffffffffffd90,
                 (int)local_10,pvStack_8,(size_t)in_RCX);
      basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)in_stack_fffffffffffffd10,
                 (char *)in_stack_fffffffffffffd08);
      internal::basic_writer<fmt::v6::buffer_range<char>_>::write
                ((basic_writer<fmt::v6::buffer_range<char>_> *)&stack0xfffffffffffffd90,local_2a8,
                 local_2a0,(size_t)in_RCX);
      basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)in_stack_fffffffffffffd10,
                 (char *)in_stack_fffffffffffffd08);
      internal::basic_writer<fmt::v6::buffer_range<char>_>::write
                ((basic_writer<fmt::v6::buffer_range<char>_> *)&stack0xfffffffffffffd90,local_2b8,
                 local_2b0,(size_t)in_RCX);
      bVar1 = true;
LAB_00267197:
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                (in_stack_fffffffffffffd10);
      if (!bVar1) {
        message_00.size_._4_4_ = iVar2;
        message_00._0_12_ = in_stack_fffffffffffffd98;
        internal::format_error_code
                  (in_stack_fffffffffffffd90.container,in_stack_fffffffffffffd8c,message_00);
      }
      return;
    }
    if (iVar2 != 0x22) {
      bVar1 = false;
      goto LAB_00267197;
    }
    in_stack_fffffffffffffd10 = &local_238;
    internal::buffer<char>::size((buffer<char> *)in_stack_fffffffffffffd10);
    internal::buffer<char>::resize
              ((buffer<char> *)in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
  } while( true );
}

Assistant:

FMT_FUNC void format_system_error(internal::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          internal::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        internal::writer w(out);
        w.write(message);
        w.write(": ");
        w.write(system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }